

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2projections.cc
# Opt level: O0

S2LatLng __thiscall S2::PlateCarreeProjection::ToLatLng(PlateCarreeProjection *this,R2Point *p)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  R2Point RVar5;
  R2Point *p_local;
  PlateCarreeProjection *this_local;
  
  dVar1 = this->to_radians_;
  dVar3 = Vector2<double>::y(p);
  dVar2 = this->to_radians_;
  dVar4 = Vector2<double>::x(p);
  dVar4 = remainder(dVar4,this->x_wrap_);
  RVar5.c_ = (VType  [2])S2LatLng::FromRadians(dVar1 * dVar3,dVar2 * dVar4);
  return (R2Point)(R2Point)RVar5.c_;
}

Assistant:

S2LatLng PlateCarreeProjection::ToLatLng(const R2Point& p) const {
  return S2LatLng::FromRadians(to_radians_ * p.y(),
                               to_radians_ * remainder(p.x(), x_wrap_));
}